

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

int Render_Single_Pass(black_PWorker worker,Bool flipped,Int y_min,Int y_max)

{
  Int *pIVar1;
  ushort uVar2;
  char *pcVar3;
  TProfileList pTVar4;
  PProfile_conflict pTVar5;
  char cVar6;
  Bool BVar7;
  short sVar8;
  uint uVar9;
  Long LVar10;
  PProfile pTVar11;
  PProfile *ppTVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  undefined4 in_register_00000014;
  ushort uVar20;
  short sVar21;
  FT_Vector *pFVar22;
  FT_Vector *pFVar23;
  ulong uVar24;
  ulong uVar25;
  PProfile_conflict pTVar26;
  byte bVar27;
  long lVar28;
  TProfileList *list;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  short sVar34;
  PProfile *ppTVar35;
  ulong uVar36;
  Int y;
  byte *pbVar37;
  FT_Vector *pFVar38;
  long local_108;
  long local_100;
  PProfile_conflict local_f8;
  TProfileList draw_left;
  ulong local_e8;
  long local_e0;
  TProfileList waiting;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  Int band_stack [32];
  
  local_d0 = CONCAT44(in_register_00000014,y_min);
  local_c8 = 0;
  local_e8 = 0;
LAB_001fdcde:
  local_c0 = (long)(int)local_d0;
  do {
    worker->minY = (long)(int)local_c8 * (long)worker->precision;
    worker->maxY = worker->precision * local_c0;
    pTVar26 = (PProfile_conflict)worker->buff;
    worker->top = (PLong)pTVar26;
    worker->error = 0;
    worker->numTurns = 0;
    worker->fProfile = (PProfile_conflict)0x0;
    worker->fresh = '\0';
    worker->joint = '\0';
    worker->maxBuff = worker->sizeBuff + -8;
    worker->cProfile = pTVar26;
    pTVar26->offset = (PLong)pTVar26;
    worker->num_Profs = 0;
    uVar20 = 0;
    lVar17 = 0;
    while (lVar17 < (worker->outline).n_contours) {
      worker->state = Unknown_State;
      worker->gProfile = (PProfile_conflict)0x0;
      pFVar22 = (worker->outline).points;
      uVar2 = (worker->outline).contours[lVar17];
      lVar30 = (long)worker->precision_scale;
      lVar32 = (long)worker->precision_half;
      lVar33 = pFVar22[uVar20].x * lVar30 - lVar32;
      local_100 = pFVar22[uVar20].y * lVar30 - lVar32;
      lVar14 = pFVar22[uVar2].x * lVar30 - lVar32;
      lVar32 = lVar30 * pFVar22[uVar2].y - lVar32;
      lVar30 = lVar32;
      local_108 = lVar33;
      if (flipped != '\0') {
        lVar30 = lVar14;
        lVar14 = lVar32;
        local_108 = local_100;
        local_100 = lVar33;
      }
      pcVar3 = (worker->outline).tags;
      pbVar37 = (byte *)(pcVar3 + uVar20);
      bVar27 = pcVar3[uVar20];
      if ((bVar27 & 4) != 0) {
        worker->dropOutControl = bVar27 >> 5;
        bVar27 = *pbVar37;
      }
      pFVar38 = pFVar22 + uVar2;
      pFVar22 = pFVar22 + uVar20;
      if ((bVar27 & 3) == 0) {
        if ((pcVar3[uVar2] & 3U) == 1) {
          pFVar38 = pFVar38 + -1;
        }
        else {
          lVar14 = (lVar14 + local_108) / 2;
          lVar30 = (lVar30 + local_100) / 2;
        }
        pFVar22 = pFVar22 + -1;
        pbVar37 = pbVar37 + -1;
        local_108 = lVar14;
        local_100 = lVar30;
      }
      else if ((bVar27 & 3) == 2) goto LAB_001fe597;
      worker->lastX = local_108;
      worker->lastY = local_100;
      local_e0 = lVar17;
      while (pFVar22 < pFVar38) {
        if ((pbVar37[1] & 3) == 0) {
          lVar17 = pFVar22[1].x * (long)worker->precision_scale - (long)worker->precision_half;
          lVar14 = (long)worker->precision_scale * pFVar22[1].y - (long)worker->precision_half;
          lVar30 = lVar14;
          if (flipped != '\0') {
            lVar30 = lVar17;
            lVar17 = lVar14;
          }
          pbVar37 = pbVar37 + 2;
          pFVar23 = pFVar22 + 2;
          while( true ) {
            if (pFVar38 <= pFVar23 + -1) {
              cVar6 = Conic_To(worker,lVar17,lVar30,local_108,local_100);
              goto LAB_001fe099;
            }
            lVar33 = pFVar23->x * (long)worker->precision_scale - (long)worker->precision_half;
            lVar14 = (long)worker->precision_scale * pFVar23->y - (long)worker->precision_half;
            lVar32 = lVar14;
            if (flipped == '\0') {
              lVar32 = lVar33;
            }
            if (flipped != '\0') {
              lVar14 = lVar33;
            }
            if ((*pbVar37 & 3) != 0) break;
            BVar7 = Conic_To(worker,lVar17,lVar30,(lVar17 + lVar32) / 2,(lVar14 + lVar30) / 2);
            pbVar37 = pbVar37 + 1;
            pFVar23 = pFVar23 + 1;
            lVar30 = lVar14;
            lVar17 = lVar32;
            if (BVar7 != '\0') goto LAB_001fe208;
          }
          if ((*pbVar37 & 3) != 1) goto LAB_001fe597;
          cVar6 = Conic_To(worker,lVar17,lVar30,lVar32,lVar14);
        }
        else if ((pbVar37[1] & 3) == 1) {
          pFVar23 = pFVar22 + 1;
          pbVar37 = pbVar37 + 1;
          LVar10 = pFVar22[1].x * (long)worker->precision_scale - (long)worker->precision_half;
          lVar30 = (long)worker->precision_scale * pFVar22[1].y - (long)worker->precision_half;
          lVar17 = lVar30;
          if (flipped != '\0') {
            lVar17 = LVar10;
            LVar10 = lVar30;
          }
          cVar6 = Line_To(worker,LVar10,lVar17);
        }
        else {
          if ((pFVar38 < pFVar22 + 2) || ((pbVar37[2] & 3) != 2)) goto LAB_001fe597;
          lVar33 = (long)worker->precision_scale;
          lVar28 = (long)worker->precision_half;
          lVar14 = pFVar22[1].x * lVar33 - lVar28;
          lVar15 = pFVar22[1].y * lVar33 - lVar28;
          lVar31 = pFVar22[2].x * lVar33 - lVar28;
          lVar32 = pFVar22[2].y * lVar33 - lVar28;
          lVar17 = lVar31;
          lVar30 = lVar15;
          if (flipped != '\0') {
            lVar17 = lVar32;
            lVar30 = lVar14;
            lVar14 = lVar15;
            lVar32 = lVar31;
          }
          pFVar23 = pFVar22 + 3;
          if (pFVar38 < pFVar23) {
            cVar6 = Cubic_To(worker,lVar14,lVar30,lVar17,lVar32,local_108,local_100);
            goto LAB_001fe099;
          }
          pbVar37 = pbVar37 + 3;
          LVar10 = pFVar22[3].x * lVar33 - lVar28;
          lVar28 = lVar33 * pFVar22[3].y - lVar28;
          lVar33 = lVar28;
          if (flipped != '\0') {
            lVar33 = LVar10;
            LVar10 = lVar28;
          }
          cVar6 = Cubic_To(worker,lVar14,lVar30,lVar17,lVar32,LVar10,lVar33);
        }
        pFVar22 = pFVar23;
        if (cVar6 != '\0') goto LAB_001fe208;
      }
      cVar6 = Line_To(worker,local_108,local_100);
LAB_001fe099:
      if (cVar6 != '\0') goto LAB_001fe208;
      uVar25 = worker->lastY;
      sVar8 = (worker->outline).contours[local_e0];
      iVar19 = worker->precision;
      uVar16 = (long)iVar19 - 1U & uVar25;
      if ((((uVar16 == 0) && (worker->minY <= (long)uVar25)) && ((long)uVar25 <= worker->maxY)) &&
         ((worker->gProfile != (PProfile_conflict)0x0 &&
          (((worker->cProfile->flags ^ worker->gProfile->flags) & 8) == 0)))) {
        worker->top = worker->top + -1;
      }
      pTVar26 = worker->cProfile;
      if ((worker->top == pTVar26->offset) || ((pTVar26->flags & 8) == 0)) {
        uVar16 = ((long)-iVar19 & (uVar25 + (long)iVar19) - 1) - uVar25;
      }
      BVar7 = End_Profile(worker,(long)worker->precision_half <= (long)uVar16);
      if (BVar7 != '\0') goto LAB_001fe208;
      if (worker->gProfile != (PProfile)0x0) {
        pTVar26->next = worker->gProfile;
      }
      uVar20 = sVar8 + 1;
      lVar17 = local_e0 + 1;
    }
    uVar20 = worker->num_Profs;
    pTVar26 = worker->fProfile;
    if (pTVar26 == (PProfile_conflict)0x0 || uVar20 < 2) {
      worker->fProfile = (PProfile_conflict)0x0;
    }
    else {
      do {
        if (uVar20 < 2) {
          pTVar11 = (PProfile)0x0;
        }
        else {
          pTVar11 = (PProfile)(pTVar26->offset + pTVar26->height);
        }
        pTVar26->link = pTVar11;
        iVar19 = (int)pTVar26->start;
        if ((pTVar26->flags & 8) == 0) {
          iVar18 = (iVar19 - (int)pTVar26->height) + 1;
          pTVar26->start = (long)iVar18;
          pTVar26->offset = pTVar26->offset + pTVar26->height + -1;
          y = iVar19 + 1;
          iVar19 = iVar18;
        }
        else {
          y = (int)pTVar26->height + iVar19;
        }
        BVar7 = Insert_Y_Turn(worker,iVar19);
        if ((BVar7 != '\0') || (BVar7 = Insert_Y_Turn(worker,y), BVar7 != '\0')) goto LAB_001fe208;
        pTVar26 = pTVar26->link;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    uVar16 = local_c8;
    uVar25 = local_e8;
    if (worker->top < worker->maxBuff) break;
LAB_001fe208:
    if (worker->error != 0x62) {
      return worker->error;
    }
    iVar19 = (int)local_c8;
    if (iVar19 == (int)local_d0) {
      return 0x62;
    }
    band_stack[(int)local_e8] = iVar19;
    local_e8 = (ulong)((int)local_e8 + 1);
    local_c8 = (ulong)(((int)local_d0 + iVar19 >> 1) + 1);
  } while( true );
  iVar18 = (int)local_e8;
  iVar19 = (int)local_c8;
  if (worker->fProfile != (PProfile_conflict)0x0) {
    waiting = (TProfileList)0x0;
    draw_left = (TProfileList)0x0;
    local_f8 = (PProfile_conflict)0x0;
    bVar27 = (byte)worker->precision_bits;
    uVar36 = worker->minY >> (bVar27 & 0x3f);
    uVar24 = worker->maxY >> (bVar27 & 0x3f);
    pTVar26 = worker->fProfile;
    while( true ) {
      sVar21 = (short)uVar36;
      sVar8 = (short)uVar24;
      if (pTVar26 == (PProfile_conflict)0x0) break;
      uVar13 = pTVar26->start;
      if ((short)uVar13 <= sVar8) {
        uVar24 = uVar13;
      }
      uVar24 = uVar24 & 0xffffffff;
      uVar9 = ((int)uVar13 + (int)pTVar26->height) - 1;
      uVar36 = uVar36 & 0xffffffff;
      if (sVar21 <= (short)uVar9) {
        uVar36 = (ulong)uVar9;
      }
      pTVar11 = pTVar26->link;
      pTVar26->X = 0;
      InsNew(&waiting,pTVar26);
      pTVar26 = pTVar11;
    }
    if (worker->numTurns == 0) {
LAB_001fe597:
      worker->error = 0x14;
      return 0x14;
    }
    (*worker->Proc_Sweep_Init)(worker,sVar8,sVar21);
    ppTVar12 = &waiting;
    while (pTVar4 = *ppTVar12, pTVar4 != (TProfileList)0x0) {
      pTVar4->countL = (int)pTVar4->start - (int)sVar8;
      ppTVar12 = &pTVar4->link;
    }
    uVar13 = (ulong)worker->numTurns;
    if ((0 < (long)uVar13) && (worker->sizeBuff[-uVar13] == (long)sVar8)) {
      uVar9 = worker->numTurns - 1;
      uVar13 = (ulong)uVar9;
      worker->numTurns = uVar9;
    }
    local_108._0_4_ = 0;
    local_d0 = uVar36;
    while( true ) {
      uVar36 = local_d0;
      iVar19 = (int)uVar16;
      iVar18 = (int)uVar25;
      if ((int)uVar13 < 1) break;
      pTVar11 = waiting;
      while (pTVar26 = pTVar11, pTVar26 != (PProfile_conflict)0x0) {
        pTVar11 = pTVar26->link;
        pIVar1 = &pTVar26->countL;
        *pIVar1 = *pIVar1 - (int)(short)(int)local_108;
        if (*pIVar1 == 0) {
          DelOld(&waiting,pTVar26);
          list = &draw_left;
          if ((pTVar26->flags & 8) == 0) {
            list = &local_f8;
          }
          InsNew(list,pTVar26);
        }
      }
      Sort(&draw_left);
      Sort(&local_f8);
      iVar19 = worker->numTurns;
      worker->numTurns = iVar19 + -1;
      local_e0 = worker->sizeBuff[-(long)iVar19];
      sVar8 = (short)worker->sizeBuff[-(long)iVar19];
      uVar25 = uVar24 & 0xffffffff;
      while (sVar21 = (short)uVar25, pTVar11 = draw_left, sVar21 < sVar8) {
        sVar34 = 0;
        ppTVar35 = &draw_left;
        ppTVar12 = &local_f8;
        while ((pTVar26 = *ppTVar35, pTVar26 != (PProfile_conflict)0x0 &&
               (pTVar5 = *ppTVar12, pTVar5 != (PProfile_conflict)0x0))) {
          uVar16 = pTVar26->X;
          uVar36 = pTVar5->X;
          lVar30 = uVar16 - uVar36;
          lVar17 = lVar30;
          if (lVar30 == 0 || (long)uVar16 < (long)uVar36) {
            lVar17 = -(uVar16 - uVar36);
          }
          uVar13 = uVar36;
          if ((long)uVar16 < (long)uVar36) {
            uVar13 = uVar16;
          }
          if (lVar30 != 0 && (long)uVar36 <= (long)uVar16) {
            uVar36 = uVar16;
          }
          lVar30 = (long)worker->precision;
          if (lVar30 < lVar17) {
LAB_001fe43f:
            (*worker->Proc_Sweep_Span)(worker,sVar21,uVar13,uVar36,pTVar26,pTVar5);
          }
          else {
            uVar16 = uVar13 & -lVar30;
            if (((uVar16 == uVar13) || (uVar29 = (uVar36 + lVar30) - 1 & -lVar30, uVar29 == uVar36))
               || (((long)uVar16 <= (long)uVar29 && (uVar29 != uVar16 + lVar30))))
            goto LAB_001fe43f;
            if ((pTVar26->flags & 7) != 2) {
              pTVar26->X = uVar13;
              pTVar5->X = uVar36;
              pTVar26->countL = 1;
              sVar34 = sVar34 + 1;
            }
          }
          ppTVar35 = &pTVar26->link;
          ppTVar12 = &pTVar5->link;
        }
        if (0 < sVar34) {
          ppTVar35 = &draw_left;
          ppTVar12 = &local_f8;
          while ((pTVar26 = *ppTVar35, pTVar26 != (PProfile_conflict)0x0 &&
                 (pTVar5 = *ppTVar12, pTVar5 != (PProfile_conflict)0x0))) {
            if (pTVar26->countL != 0) {
              pTVar26->countL = 0;
              (*worker->Proc_Sweep_Drop)(worker,sVar21,pTVar26->X,pTVar5->X,pTVar26,pTVar5);
            }
            ppTVar35 = &pTVar26->link;
            ppTVar12 = &pTVar5->link;
          }
        }
        (*worker->Proc_Sweep_Step)(worker);
        uVar9 = (int)uVar25 + 1;
        uVar25 = (ulong)uVar9;
        if ((short)uVar9 < sVar8) {
          Sort(&draw_left);
          Sort(&local_f8);
        }
      }
      while (pTVar26 = pTVar11, pTVar11 = local_f8, pTVar26 != (PProfile_conflict)0x0) {
        pTVar11 = pTVar26->link;
        if (pTVar26->height == 0) {
          DelOld(&draw_left,pTVar26);
        }
      }
      while (pTVar26 = pTVar11, pTVar26 != (PProfile_conflict)0x0) {
        pTVar11 = pTVar26->link;
        if (pTVar26->height == 0) {
          DelOld(&local_f8,pTVar26);
        }
      }
      local_108._0_4_ = (int)uVar24;
      local_108._0_4_ = (int)local_e0 - (int)local_108;
      uVar13 = (ulong)(uint)worker->numTurns;
      uVar24 = uVar25;
      uVar16 = local_c8;
      uVar25 = local_e8;
    }
    for (; (short)uVar24 <= (short)uVar36; uVar24 = (ulong)((int)uVar24 + 1)) {
      (*worker->Proc_Sweep_Step)(worker);
    }
  }
  if (iVar18 < 1) {
    return 0;
  }
  local_e8 = (ulong)(iVar18 - 1);
  local_d0 = (ulong)(iVar19 - 1);
  local_c8 = (ulong)(uint)band_stack[local_e8];
  goto LAB_001fdcde;
}

Assistant:

static int
  Render_Single_Pass( RAS_ARGS Bool  flipped,
                               Int   y_min,
                               Int   y_max )
  {
    Int  y_mid;
    Int  band_top = 0;
    Int  band_stack[32];  /* enough to bisect 32-bit int bands */


    while ( 1 )
    {
      ras.minY = (Long)y_min * ras.precision;
      ras.maxY = (Long)y_max * ras.precision;

      ras.top = ras.buff;

      ras.error = Raster_Err_Ok;

      if ( Convert_Glyph( RAS_VARS flipped ) )
      {
        if ( ras.error != Raster_Err_Raster_Overflow )
          return ras.error;

        /* sub-banding */

        if ( y_min == y_max )
          return ras.error;  /* still Raster_Overflow */

        y_mid = ( y_min + y_max ) >> 1;

        band_stack[band_top++] = y_min;
        y_min                  = y_mid + 1;
      }
      else
      {
        if ( ras.fProfile )
          if ( Draw_Sweep( RAS_VAR ) )
             return ras.error;

        if ( --band_top < 0 )
          break;

        y_max = y_min - 1;
        y_min = band_stack[band_top];
      }
    }

    return Raster_Err_Ok;
  }